

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGearConstraint.cpp
# Opt level: O2

void __thiscall btGearConstraint::getInfo2(btGearConstraint *this,btConstraintInfo2 *info)

{
  btScalar *pbVar1;
  btVector3 bVar2;
  btVector3 bVar3;
  btScalar local_28;
  
  bVar2 = operator*(&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                     m_worldTransform.m_basis,&this->m_axisInA);
  bVar3 = operator*(&(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                     m_worldTransform.m_basis,&this->m_axisInB);
  pbVar1 = info->m_J1angularAxis;
  *(long *)pbVar1 = bVar2.m_floats._0_8_;
  local_28 = bVar2.m_floats[2];
  pbVar1[2] = local_28;
  pbVar1 = info->m_J2angularAxis;
  *pbVar1 = this->m_ratio * bVar3.m_floats[0];
  pbVar1[1] = bVar3.m_floats[1] * this->m_ratio;
  pbVar1[2] = bVar3.m_floats[2] * this->m_ratio;
  return;
}

Assistant:

void btGearConstraint::getInfo2 (btConstraintInfo2* info)
{
	btVector3 globalAxisA, globalAxisB;

	globalAxisA = m_rbA.getWorldTransform().getBasis()*this->m_axisInA;
	globalAxisB = m_rbB.getWorldTransform().getBasis()*this->m_axisInB;

	info->m_J1angularAxis[0] = globalAxisA[0];
	info->m_J1angularAxis[1] = globalAxisA[1];
	info->m_J1angularAxis[2] = globalAxisA[2];

	info->m_J2angularAxis[0] = m_ratio*globalAxisB[0];
	info->m_J2angularAxis[1] = m_ratio*globalAxisB[1];
	info->m_J2angularAxis[2] = m_ratio*globalAxisB[2];

}